

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O1

BinsSelectExpr * __thiscall
slang::ast::BinSelectWithFilterExpr::fromSyntax
          (BinSelectWithFilterExpr *this,BinSelectWithFilterExprSyntax *syntax,ASTContext *context)

{
  SyntaxNode *pSVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  Scope *args;
  long lVar5;
  ExpressionSyntax *syntax_00;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  Type *pTVar9;
  IteratorSymbol *pIVar10;
  Expression *expr;
  ExpressionPatternSyntax *pEVar11;
  BinSelectWithFilterExpr *pBVar12;
  char *func;
  long lVar13;
  Expression *matches;
  ASTContext iterCtx;
  Expression *local_88;
  BumpAllocator *local_80;
  BinsSelectExpr *local_78;
  BinSelectWithFilterExpr *local_70;
  ASTContext local_68;
  BinsSelectExpr *pBVar8;
  
  pSVar1 = (syntax->super_BinsSelectExpressionSyntax).super_SyntaxNode.parent;
  if (pSVar1 != (SyntaxNode *)0x0) {
    if (this->expr == (BinsSelectExpr *)0x0) {
      func = 
      "T slang::not_null<slang::syntax::BinsSelectExpressionSyntax *>::get() const [T = slang::syntax::BinsSelectExpressionSyntax *]"
      ;
      goto LAB_003c4851;
    }
    local_80 = (BumpAllocator *)pSVar1->parent;
    iVar7 = BinsSelectExpr::bind((int)this->expr,(sockaddr *)syntax,(socklen_t)context);
    pBVar8 = (BinsSelectExpr *)CONCAT44(extraout_var,iVar7);
    local_68.assertionInstance = (AssertionInstanceDetails *)(syntax->openParen).info;
    local_68.scope.ptr = (Scope *)(syntax->super_BinsSelectExpressionSyntax).super_SyntaxNode.parent
    ;
    local_68.lookupIndex = (syntax->super_BinsSelectExpressionSyntax).super_SyntaxNode.kind;
    local_68._12_4_ =
         *(undefined4 *)&(syntax->super_BinsSelectExpressionSyntax).super_SyntaxNode.field_0xc;
    local_68.flags.m_bits = (underlying_type)(syntax->expr).ptr;
    local_68.instanceOrProc = *(Symbol **)&syntax->with;
    local_68.firstTempVar = (TempVarSymbol *)(syntax->with).info;
    local_68.randomizeDetails = *(RandomizeDetails **)&syntax->openParen;
    pSVar1 = (syntax->super_BinsSelectExpressionSyntax).super_SyntaxNode.parent;
    if (pSVar1 != (SyntaxNode *)0x0) {
      piVar2 = *(int **)(*(long *)(*(long *)&pSVar1->kind + 0x20) + 8);
      local_78 = pBVar8;
      local_70 = this;
      if (*piVar2 != 0x57) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                   ,0xc4,
                   "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::CoverCrossSymbol]");
      }
      lVar3 = *(long *)(piVar2 + 0x1e);
      if (lVar3 != 0) {
        lVar4 = *(long *)(piVar2 + 0x1c);
        lVar13 = 0;
        do {
          args = (Scope *)(syntax->super_BinsSelectExpressionSyntax).super_SyntaxNode.parent;
          if (args == (Scope *)0x0) goto LAB_003c483c;
          lVar5 = *(long *)(lVar4 + lVar13);
          pTVar9 = DeclaredType::getType((DeclaredType *)(lVar5 + 0x70));
          pIVar10 = BumpAllocator::
                    emplace<slang::ast::IteratorSymbol,slang::ast::Scope_const&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,slang::ast::Type_const&>
                              (local_80,args,
                               (basic_string_view<char,_std::char_traits<char>_> *)(lVar5 + 8),
                               (SourceLocation *)(lVar5 + 0x18),pTVar9);
          (pIVar10->super_TempVarSymbol).nextTemp = local_68.firstTempVar;
          lVar13 = lVar13 + 8;
          local_68.firstTempVar = &pIVar10->super_TempVarSymbol;
        } while (lVar3 << 3 != lVar13);
      }
      pBVar12 = local_70;
      if (local_70[1].expr != (BinsSelectExpr *)0x0) {
        expr = bindCovergroupExpr((ExpressionSyntax *)local_70[1].expr,&local_68,(Type *)0x0,
                                  (bitmask<slang::ast::ASTFlags>)0x0);
        ASTContext::requireBooleanConvertible(&local_68,expr);
        local_88 = (Expression *)0x0;
        if (*(long *)&pBVar12[2].super_BinsSelectExpr == 0) {
LAB_003c4816:
          pBVar12 = BumpAllocator::
                    emplace<slang::ast::BinSelectWithFilterExpr,slang::ast::BinsSelectExpr_const&,slang::ast::Expression_const&,slang::ast::Expression_const*&>
                              (local_80,local_78,expr,&local_88);
          return &pBVar12->super_BinsSelectExpr;
        }
        pSVar1 = *(SyntaxNode **)(*(long *)&pBVar12[2].super_BinsSelectExpr + 0x20);
        if (pSVar1 == (SyntaxNode *)0x0) {
          func = 
          "T slang::not_null<slang::syntax::PatternSyntax *>::get() const [T = slang::syntax::PatternSyntax *]"
          ;
          goto LAB_003c4851;
        }
        pEVar11 = slang::syntax::SyntaxNode::as<slang::syntax::ExpressionPatternSyntax>(pSVar1);
        syntax_00 = (pEVar11->expr).ptr;
        if (syntax_00 != (ExpressionSyntax *)0x0) {
          local_88 = bindCovergroupExpr(syntax_00,(ASTContext *)syntax,(Type *)0x0,
                                        (bitmask<slang::ast::ASTFlags>)0x800);
          bVar6 = Expression::bad(local_88);
          if (!bVar6) {
            pTVar9 = (local_88->type).ptr;
            if (pTVar9 == (Type *)0x0) {
              func = 
              "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
              ;
              goto LAB_003c4851;
            }
            if (pTVar9->canonical == (Type *)0x0) {
              Type::resolveCanonical(pTVar9);
            }
            if ((pTVar9->canonical->super_Symbol).kind != UnboundedType) {
              ASTContext::requireIntegral((ASTContext *)syntax,local_88);
            }
          }
          goto LAB_003c4816;
        }
      }
      func = 
      "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
      ;
      goto LAB_003c4851;
    }
  }
LAB_003c483c:
  func = "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
  ;
LAB_003c4851:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

BinsSelectExpr& BinSelectWithFilterExpr::fromSyntax(const BinSelectWithFilterExprSyntax& syntax,
                                                    const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& expr = bind(*syntax.expr, context);

    // Create the iterator variables for all of the parent cross items
    // and then bind the filter expression.
    ASTContext iterCtx = context;

    auto& cross = context.scope->asSymbol().getParentScope()->asSymbol().as<CoverCrossSymbol>();
    for (auto target : cross.targets) {
        auto it = comp.emplace<IteratorSymbol>(*context.scope, target->name, target->location,
                                               target->getType());
        it->nextTemp = std::exchange(iterCtx.firstTempVar, it);
    }

    auto& filter = bindCovergroupExpr(*syntax.filter, iterCtx);
    iterCtx.requireBooleanConvertible(filter);

    const Expression* matches = nullptr;
    if (syntax.matchesClause) {
        matches =
            &bindCovergroupExpr(*syntax.matchesClause->pattern->as<ExpressionPatternSyntax>().expr,
                                context, nullptr, ASTFlags::AllowUnboundedLiteral);
        if (!matches->bad() && !matches->type->isUnbounded())
            context.requireIntegral(*matches);
    }

    return *comp.emplace<BinSelectWithFilterExpr>(expr, filter, matches);
}